

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

StringRef __thiscall
llvm::yaml::
ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::input(ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,StringRef Scalar,void *param_2,string *Val)

{
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_40 = &local_30;
  if (this == (ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)0x0) {
    local_38 = 0;
    local_30 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,this,Scalar.Data + (long)this);
  }
  std::__cxx11::string::operator=((string *)param_2,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return (StringRef)ZEXT816(0);
}

Assistant:

StringRef ScalarTraits<std::string>::input(StringRef Scalar, void *,
                                         std::string &Val) {
  Val = Scalar.str();
  return StringRef();
}